

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_paged_audio_buffer__data_source_on_get_data_format
                    (ma_data_source *pDataSource,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_format *pmVar1;
  
  pmVar1 = *(ma_format **)((long)pDataSource + 0x48);
  *pFormat = *pmVar1;
  *pChannels = pmVar1[1];
  *pSampleRate = 0;
  ma_channel_map_init_standard(ma_standard_channel_map_default,pChannelMap,channelMapCap,pmVar1[1]);
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_paged_audio_buffer__data_source_on_get_data_format(ma_data_source* pDataSource, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    ma_paged_audio_buffer* pPagedAudioBuffer = (ma_paged_audio_buffer*)pDataSource;

    *pFormat     = pPagedAudioBuffer->pData->format;
    *pChannels   = pPagedAudioBuffer->pData->channels;
    *pSampleRate = 0;   /* There is no notion of a sample rate with audio buffers. */
    ma_channel_map_init_standard(ma_standard_channel_map_default, pChannelMap, channelMapCap, pPagedAudioBuffer->pData->channels);

    return MA_SUCCESS;
}